

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
          (CodedInputStream *this,Limit limit)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  uint8_t *puVar4;
  long lVar5;
  string *psVar6;
  int iVar7;
  int iVar8;
  undefined1 *puVar9;
  undefined1 local_20 [16];
  
  bVar1 = this->legitimate_message_end_;
  this->current_limit_ = limit;
  iVar3 = this->buffer_size_after_limit_;
  puVar4 = this->buffer_end_;
  this->buffer_end_ = puVar4 + iVar3;
  if (this->total_bytes_limit_ < limit) {
    limit = this->total_bytes_limit_;
  }
  iVar7 = this->total_bytes_read_ - limit;
  if (iVar7 == 0 || this->total_bytes_read_ < limit) {
    this->buffer_size_after_limit_ = 0;
  }
  else {
    this->buffer_size_after_limit_ = iVar7;
    this->buffer_end_ = puVar4 + iVar3 + -(long)iVar7;
  }
  this->legitimate_message_end_ = false;
  if (this->recursion_budget_ < this->recursion_limit_) {
    psVar6 = (string *)0x0;
  }
  else {
    psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)this->recursion_budget_,(long)this->recursion_limit_,
                        "recursion_budget_ < recursion_limit_");
  }
  if (psVar6 == (string *)0x0) {
    this->recursion_budget_ = this->recursion_budget_ + 1;
    return bVar1;
  }
  puVar9 = local_20;
  DecrementRecursionDepthAndPopLimit();
  uVar2 = puVar9[0x24];
  iVar7 = (int)psVar6;
  *(int *)(puVar9 + 0x28) = iVar7;
  iVar3 = *(int *)(puVar9 + 0x2c);
  lVar5 = *(long *)(puVar9 + 8);
  *(long *)(puVar9 + 8) = iVar3 + lVar5;
  if (*(int *)(puVar9 + 0x30) < iVar7) {
    iVar7 = *(int *)(puVar9 + 0x30);
  }
  iVar8 = *(int *)(puVar9 + 0x18) - iVar7;
  if (iVar8 == 0 || *(int *)(puVar9 + 0x18) < iVar7) {
    *(undefined4 *)(puVar9 + 0x2c) = 0;
  }
  else {
    *(int *)(puVar9 + 0x2c) = iVar8;
    *(long *)(puVar9 + 8) = (iVar3 + lVar5) - (long)iVar8;
  }
  puVar9[0x24] = 0;
  return (bool)uVar2;
}

Assistant:

bool CodedInputStream::DecrementRecursionDepthAndPopLimit(Limit limit) {
  bool result = ConsumedEntireMessage();
  PopLimit(limit);
  ABSL_DCHECK_LT(recursion_budget_, recursion_limit_);
  ++recursion_budget_;
  return result;
}